

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O3

trie_node * trie_remove(trie_node *root,lrtr_ip_addr *prefix,uint8_t mask_len,uint lvl)

{
  long lVar1;
  trie_node *ptVar2;
  void *pvVar3;
  undefined1 (*pauVar4) [12];
  undefined8 uVar5;
  lrtr_ip_addr a;
  lrtr_ip_addr a_00;
  lrtr_ip_addr prefix_00;
  lrtr_ip_addr b;
  lrtr_ip_addr b_00;
  _Bool _Var6;
  trie_node *ptVar7;
  uint8_t *puVar8;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff9c;
  lrtr_ip_version in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined8 uStack_40;
  undefined4 local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (root->len == mask_len) {
    local_38 = (prefix->u).addr6.addr[3];
    pauVar4 = (undefined1 (*) [12])((long)&prefix->u + 4);
    uStack_40 = *(undefined8 *)*pauVar4;
    in_stack_ffffffffffffffa0 = (lrtr_ip_version)*(undefined8 *)prefix;
    a.u.addr6.addr[2] = in_stack_ffffffffffffff9c;
    a._0_12_ = *(undefined1 (*) [12])((long)&(root->prefix).u + 4);
    a.u.addr6.addr[3] = in_stack_ffffffffffffffa0;
    b.u.addr6.addr[2] = in_stack_ffffffffffffffb4;
    b._0_12_ = *pauVar4;
    b.u.addr6.addr[3] = in_stack_ffffffffffffffa0;
    _Var6 = lrtr_ip_addr_equal(a,b);
    if (_Var6) {
      puVar8 = &root->len;
      ptVar7 = root;
      do {
        root = ptVar7->rchild;
        ptVar2 = ptVar7->lchild;
        if (ptVar2 == (trie_node *)0x0) {
          if (root == (trie_node *)0x0) {
            ptVar2 = ptVar7->parent;
            if (ptVar2 != (trie_node *)0x0) {
              (&ptVar2->rchild)[ptVar2->lchild == ptVar7] = (trie_node *)0x0;
            }
            goto LAB_00102691;
          }
        }
        else if ((root == (trie_node *)0x0) || (ptVar2->len < root->len)) {
          root = ptVar2;
        }
        pvVar3 = ptVar7->data;
        uVar5 = *(undefined8 *)((long)&(root->prefix).u + 4);
        *(undefined8 *)&ptVar7->prefix = *(undefined8 *)&root->prefix;
        *(undefined8 *)((long)&(ptVar7->prefix).u + 4) = uVar5;
        (ptVar7->prefix).u.addr6.addr[3] = (root->prefix).u.addr6.addr[3];
        mask_len = root->len;
        *puVar8 = mask_len;
        ptVar7->data = root->data;
        root->data = pvVar3;
        lvl = lvl + 1;
        local_38 = (root->prefix).u.addr6.addr[3];
        pauVar4 = (undefined1 (*) [12])((long)&(root->prefix).u + 4);
        uStack_40 = *(undefined8 *)*pauVar4;
        in_stack_ffffffffffffffa0 = (lrtr_ip_version)*(undefined8 *)&root->prefix;
        a_00.u.addr6.addr[2] = in_stack_ffffffffffffff9c;
        a_00._0_12_ = *(undefined1 (*) [12])((long)&(root->prefix).u + 4);
        a_00.u.addr6.addr[3] = in_stack_ffffffffffffffa0;
        b_00.u.addr6.addr[2] = in_stack_ffffffffffffffb4;
        b_00._0_12_ = *pauVar4;
        b_00.u.addr6.addr[3] = in_stack_ffffffffffffffa0;
        _Var6 = lrtr_ip_addr_equal(a_00,b_00);
        puVar8 = &root->len;
        ptVar7 = root;
        prefix = &root->prefix;
      } while (_Var6);
    }
  }
  lrtr_ip_addr_get_bits((lrtr_ip_addr *)&stack0xffffffffffffffb8,prefix,(uint8_t)lvl,'\x01');
  prefix_00.u.addr6.addr[1] = local_38;
  prefix_00._0_8_ = uStack_40;
  prefix_00.u.addr6.addr[2] = in_stack_ffffffffffffff9c;
  prefix_00.u.addr6.addr[3] = in_stack_ffffffffffffffa0;
  _Var6 = lrtr_ip_addr_is_zero(prefix_00);
  if (_Var6) {
    ptVar7 = root->lchild;
  }
  else {
    ptVar7 = root->rchild;
  }
  if (ptVar7 == (trie_node *)0x0) {
    ptVar7 = (trie_node *)0x0;
  }
  else {
    ptVar7 = trie_remove(ptVar7,prefix,mask_len,lvl + 1);
  }
LAB_00102691:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return ptVar7;
}

Assistant:

struct trie_node *trie_remove(struct trie_node *root, const struct lrtr_ip_addr *prefix, const uint8_t mask_len,
			      const unsigned int lvl)
{
	/* If the node has no children we can simply remove it
	 * If the node has children, we swap the node with the child that
	 * has the smaller prefix length and drop the child.
	 */
	if (prefix_is_same(root, prefix, mask_len)) {
		void *tmp;

		if (trie_is_leaf(root)) {
			deref_node(root);
			return root;
		}

		/* swap with the left child and drop the child */
		if (root->lchild && (!root->rchild || root->lchild->len < root->rchild->len)) {
			tmp = root->data;
			replace_node_data(root, root->lchild);
			root->lchild->data = tmp;

			return trie_remove(root->lchild, &root->lchild->prefix, root->lchild->len, lvl + 1);
		}

		/* swap with the right child and drop the child */
		tmp = root->data;
		replace_node_data(root, root->rchild);
		root->rchild->data = tmp;

		return trie_remove(root->rchild, &root->rchild->prefix, root->rchild->len, lvl + 1);
	}

	if (is_left_child(prefix, lvl)) {
		if (!root->lchild)
			return NULL;
		return trie_remove(root->lchild, prefix, mask_len, lvl + 1);
	}

	if (!root->rchild)
		return NULL;
	return trie_remove(root->rchild, prefix, mask_len, lvl + 1);
}